

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

void __thiscall xe::TestNode::getFullPath(TestNode *this,string *dst)

{
  int iVar1;
  size_t __n;
  int iVar2;
  TestGroup *pTVar3;
  int iVar4;
  
  dst->_M_string_length = 0;
  *(dst->_M_dataplus)._M_p = '\0';
  pTVar3 = (TestGroup *)this;
  iVar2 = 0;
  do {
    iVar4 = iVar2;
    iVar1 = (int)*(size_type *)((long)&pTVar3->super_TestNode + 0x20);
    pTVar3 = *(TestGroup **)((long)&pTVar3->super_TestNode + 8);
    iVar2 = iVar4 + 1 + iVar1;
  } while ((pTVar3->super_TestNode).m_nodeType != TESTNODETYPE_ROOT);
  iVar4 = iVar4 + iVar1;
  std::__cxx11::string::resize((ulong)dst,(char)iVar4);
  while( true ) {
    __n = (((TestGroup *)this)->super_TestNode).m_name._M_string_length;
    if (__n != 0) {
      memmove((dst->_M_dataplus)._M_p + ((long)iVar4 - __n),
              (((TestGroup *)this)->super_TestNode).m_name._M_dataplus._M_p,__n);
    }
    if ((((((TestGroup *)this)->super_TestNode).m_parent)->super_TestNode).m_nodeType ==
        TESTNODETYPE_ROOT) break;
    iVar4 = iVar4 + ~(uint)(((TestGroup *)this)->super_TestNode).m_name._M_string_length;
    (dst->_M_dataplus)._M_p[iVar4] = '.';
    this = &((((TestGroup *)this)->super_TestNode).m_parent)->super_TestNode;
  }
  return;
}

Assistant:

void TestNode::getFullPath (std::string& dst) const
{
	dst.clear();

	int				nameLen	= 0;
	const TestNode*	curNode	= this;

	for (;;)
	{
		nameLen += (int)curNode->m_name.length();

		DE_ASSERT(curNode->m_parent);
		if (curNode->m_parent->getNodeType() != TESTNODETYPE_ROOT)
		{
			nameLen += 1;
			curNode  = curNode->m_parent;
		}
		else
			break;
	}

	dst.resize(nameLen);

	curNode = this;
	int pos = nameLen;

	for (;;)
	{
		std::copy(curNode->m_name.begin(), curNode->m_name.end(), dst.begin()+(pos-curNode->m_name.length()));
		pos -= (int)curNode->m_name.length();

		DE_ASSERT(curNode->m_parent);
		if (curNode->m_parent->getNodeType() != TESTNODETYPE_ROOT)
		{
			dst[--pos] = '.';
			curNode = curNode->m_parent;
		}
		else
			break;
	}
}